

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O3

size_t __thiscall
ProductAggregate_hash::operator()(ProductAggregate_hash *this,ProductAggregate *key)

{
  long lVar1;
  ulong uVar2;
  pair<unsigned_long,_unsigned_long> *d;
  pointer ppVar3;
  ulong uVar4;
  
  lVar1 = std::_Hash_bytes(key,0xbc,0xc70f6907);
  uVar4 = 0;
  for (ppVar3 = (key->viewAggregate).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (key->viewAggregate).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    uVar4 = uVar4 * 0x40 + 0x9e3779b9 + (uVar4 >> 2) + ppVar3->first ^ uVar4;
    uVar4 = (uVar4 >> 2) + uVar4 * 0x40 + ppVar3->second + 0x9e3779b9 ^ uVar4;
  }
  uVar2 = lVar1 + 0x9e3779b9;
  uVar2 = uVar2 * 0x40 + 0x9e3779b9 + (uVar2 >> 2) + (key->previous).first ^ uVar2;
  uVar2 = (uVar2 >> 2) + uVar2 * 0x40 + (key->previous).second + 0x9e3779b9 ^ uVar2;
  uVar2 = uVar2 * 0x40 + 0x9e3779b9 + (uVar2 >> 2) + uVar4 ^ uVar2;
  return (uVar2 >> 2) + uVar2 * 0x40 + (ulong)key->multiplyByCount + 0x9e3779b9 ^ uVar2;
}

Assistant:

size_t operator()(const ProductAggregate &key ) const
    {
        size_t h = 0;
        h ^= std::hash<prod_bitset>()(key.product)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<std::vector<std::pair<size_t,size_t>>>()(key.viewAggregate)+
            0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.multiplyByCount)+0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }